

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::implements(Type *this,Type *ifaceClass)

{
  bool bVar1;
  reference ppTVar2;
  Type *iface;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *__range2;
  Type *c;
  Type *in_stack_00000060;
  Type *in_stack_00000068;
  ClassType *in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffb0;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
  local_40;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> local_38;
  span<const_slang::ast::Type_*const,_18446744073709551615UL> *local_28;
  Type *local_20;
  
  local_20 = getCanonicalType(in_stack_ffffffffffffffb0);
  bVar1 = isClass((Type *)0x820957);
  if (bVar1) {
    Symbol::as<slang::ast::ClassType>((Symbol *)0x82096f);
    local_38 = ClassType::getImplementedInterfaces(in_stack_ffffffffffffffa8);
    local_28 = &local_38;
    local_40._M_current =
         (Type **)std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::begin
                            ((span<const_slang::ast::Type_*const,_18446744073709551615UL> *)
                             in_stack_ffffffffffffffa8);
    std::span<const_slang::ast::Type_*const,_18446744073709551615UL>::end(in_stack_ffffffffffffffb8)
    ;
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffffa8), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppTVar2 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
                ::operator*(&local_40);
      in_stack_ffffffffffffffb0 = *ppTVar2;
      bVar1 = isMatching(in_stack_00000068,in_stack_00000060);
      if (bVar1) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Type_*const_*,_std::span<const_slang::ast::Type_*const,_18446744073709551615UL>_>
      ::operator++(&local_40);
    }
  }
  return false;
}

Assistant:

bool Type::implements(const Type& ifaceClass) const {
    const Type* c = &getCanonicalType();
    if (!c->isClass())
        return false;

    for (auto iface : c->as<ClassType>().getImplementedInterfaces()) {
        if (iface->isMatching(ifaceClass))
            return true;
    }

    return false;
}